

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::insert
          (QMovableArrayOps<std::pair<double,_QVariant>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  long in_RDX;
  long in_RSI;
  pair<double,_QVariant> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  pair<double,_QVariant> copy;
  pair<double,_QVariant> *in_stack_ffffffffffffff58;
  pair<double,_QVariant> *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff70;
  uint uVar1;
  byte bVar2;
  undefined4 in_stack_ffffffffffffff74;
  GrowthPosition in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar3;
  long local_70;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_30,&DAT_009ee1f8,0x28);
  std::pair<double,_QVariant>::pair(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  uVar1 = in_stack_ffffffffffffff70 & 0xffffff;
  if (*(qsizetype *)((long)&(in_RDI->second).d.data + 8) != 0) {
    uVar1 = CONCAT13(in_RSI == 0,(int3)in_stack_ffffffffffffff70);
  }
  bVar2 = (byte)(uVar1 >> 0x18);
  uVar3 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff84);
  QArrayDataPointer<std::pair<double,_QVariant>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<double,_QVariant>_> *)CONCAT44(uVar3,(uint)bVar2),
             in_stack_ffffffffffffff7c,CONCAT44(in_stack_ffffffffffffff74,uVar1),
             (pair<double,_QVariant> **)in_RDI,
             (QArrayDataPointer<std::pair<double,_QVariant>_> *)in_stack_ffffffffffffff60);
  local_70 = in_RDX;
  if ((uVar3 & 0x1000000) == 0) {
    Inserter::Inserter((Inserter *)CONCAT44(in_stack_ffffffffffffff74,uVar1),
                       (QArrayDataPointer<std::pair<double,_QVariant>_> *)in_RDI,
                       (qsizetype)in_stack_ffffffffffffff60,(qsizetype)in_stack_ffffffffffffff58);
    Inserter::insertFill
              ((Inserter *)CONCAT44(in_stack_ffffffffffffff74,uVar1),in_RDI,
               (qsizetype)in_stack_ffffffffffffff60);
    Inserter::~Inserter((Inserter *)CONCAT44(in_stack_ffffffffffffff74,uVar1));
  }
  else {
    while (local_70 != 0) {
      QArrayDataPointer<std::pair<double,_QVariant>_>::begin
                ((QArrayDataPointer<std::pair<double,_QVariant>_> *)0x695d3b);
      std::pair<double,_QVariant>::pair(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      (in_RDI->second).d.data.shared =
           (PrivateShared *)((pair<double,_QVariant> *)(in_RDI->second).d.data.shared + -1);
      *(qsizetype *)((long)&(in_RDI->second).d.data + 8) =
           *(qsizetype *)((long)&(in_RDI->second).d.data + 8) + 1;
      local_70 = local_70 + -1;
    }
  }
  std::pair<double,_QVariant>::~pair((pair<double,_QVariant> *)0x695deb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }